

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_setmode.c
# Opt level: O0

int mpt_stream_setmode(mpt_stream *stream,int mode)

{
  uint uVar1;
  int *piVar2;
  uint local_1c;
  int flags;
  int mode_local;
  mpt_stream *stream_local;
  
  if ((mode & 0xfU) == 0) {
    uVar1 = mpt_stream_flags(&stream->_info);
    if ((mode & 0x10U) == 0) {
      if ((stream->_rd)._dec != (mpt_data_decoder_t)0x0) {
        (*(stream->_rd)._dec)(&(stream->_rd)._state,(iovec *)0x0,0);
      }
      if ((stream->_rd).data.max != 0) {
        if ((uVar1 & 0x40) == 0) {
          if ((uVar1 & 0x10) != 0) {
            free((stream->_rd).data.base);
          }
        }
        else {
          munmap((stream->_rd).data.base,(stream->_rd).data.max);
        }
      }
      (stream->_rd).data.base = (void *)0x0;
      (stream->_rd).data.len = 0;
      (stream->_rd).data.max = 0;
      (stream->_rd).data.off = 0;
      local_1c = mode;
    }
    else {
      local_1c = uVar1 & 0x50 | mode;
    }
    if ((local_1c & 0x20) == 0) {
      if ((stream->_wd)._enc != (mpt_data_encoder_t)0x0) {
        (*(stream->_wd)._enc)(&(stream->_wd)._state,(iovec *)0x0,(iovec *)0x0);
      }
      if ((stream->_wd).data.max != 0) {
        if ((uVar1 & 0x80) == 0) {
          if ((uVar1 & 0x20) != 0) {
            free((stream->_wd).data.base);
          }
        }
        else {
          munmap((stream->_wd).data.base,(stream->_wd).data.max);
        }
      }
      (stream->_wd).data.base = (void *)0x0;
      (stream->_wd).data.len = 0;
      (stream->_wd).data.max = 0;
      (stream->_wd).data.off = 0;
    }
    else {
      local_1c = uVar1 & 0xa0 | local_1c;
    }
    (stream->_info)._fd = (stream->_info)._fd & 0xffffffffffffff03 | (long)(int)local_1c;
    stream_local._4_4_ = local_1c;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    stream_local._4_4_ = 0xffffffff;
  }
  return stream_local._4_4_;
}

Assistant:

extern int mpt_stream_setmode(MPT_STRUCT(stream) *stream, int mode)
{
	static const MPT_STRUCT(queue) qinit = MPT_QUEUE_INIT;
	int flags;
	
	if (mode & 0xf) {
		errno = EINVAL;
		return -1;
	}
	flags = mpt_stream_flags(&stream->_info);
	
	/* keep read queue */
	if (mode & (MPT_STREAMFLAG(ReadBuf))) {
		mode |= flags & (MPT_STREAMFLAG(ReadBuf) | MPT_STREAMFLAG(ReadMap));
	}
	/* clear read queue */
	else {
		if (stream->_rd._dec) {
			stream->_rd._dec(&stream->_rd._state, 0, 0);
		}
		if (stream->_rd.data.max) {
			if (flags & MPT_STREAMFLAG(ReadMap)) {
				munmap(stream->_rd.data.base, stream->_rd.data.max);
			}
			else if (flags & MPT_STREAMFLAG(ReadBuf)) {
				free(stream->_rd.data.base);
			}
		}
		/* invalidate read queue */
		stream->_rd.data = qinit;
	}
	/* keep write queue */
	if (mode & (MPT_STREAMFLAG(WriteBuf))) {
		mode |= flags & (MPT_STREAMFLAG(WriteBuf) | MPT_STREAMFLAG(WriteMap));
	}
	/* clear write queue */
	else {
		if (stream->_wd._enc) {
			stream->_wd._enc(&stream->_wd._state, 0, 0);
		}
		if (stream->_wd.data.max) {
			if (flags & MPT_STREAMFLAG(WriteMap)) {
				munmap(stream->_wd.data.base, stream->_wd.data.max);
			}
			else if (flags & MPT_STREAMFLAG(WriteBuf)) {
				free(stream->_wd.data.base);
			}
		}
		/* invalidate write queue */
		stream->_wd.data = qinit;
	}
	stream->_info._fd = (stream->_info._fd & ~0xfc) | mode;
	
	return mode;
}